

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O2

base_learner * svrg_setup(options_i *options,vw *all)

{
  option_group_definition *this;
  typed_option<int> *ptVar1;
  learner<SVRG::svrg,_example> *plVar2;
  uint32_t *puVar3;
  bool svrg_option;
  allocator local_38c;
  allocator local_38b;
  allocator local_38a;
  allocator local_389;
  free_ptr<SVRG::svrg> s;
  string local_378 [32];
  string local_358;
  string local_338 [32];
  string local_318;
  string local_2f8;
  option_group_definition new_options;
  undefined1 local_2a0 [112];
  bool local_230;
  typed_option<int> local_200;
  typed_option<int> local_160;
  typed_option<bool> local_c0;
  
  scoped_calloc_or_throw<SVRG::svrg>();
  svrg_option = false;
  std::__cxx11::string::string
            ((string *)&local_2f8,"Stochastic Variance Reduced Gradient",(allocator *)local_2a0);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_318,"svrg",&local_389);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a0,&local_318,&svrg_option);
  local_230 = true;
  std::__cxx11::string::string
            (local_338,"Streaming Stochastic Variance Reduced Gradient",&local_38a);
  std::__cxx11::string::_M_assign((string *)(local_2a0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c0,(typed_option<bool> *)local_2a0);
  this = VW::config::option_group_definition::add<bool>(&new_options,&local_c0);
  std::__cxx11::string::string((string *)&local_358,"stage_size",&local_38b);
  VW::config::typed_option<int>::typed_option
            (&local_200,&local_358,
             &(s._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->stage_size);
  ptVar1 = VW::config::typed_option<int>::default_value(&local_200,1);
  std::__cxx11::string::string(local_378,"Number of passes per SVRG stage",&local_38c);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_160,ptVar1);
  VW::config::option_group_definition::add<int>(this,&local_160);
  VW::config::typed_option<int>::~typed_option(&local_160);
  std::__cxx11::string::~string(local_378);
  VW::config::typed_option<int>::~typed_option(&local_200);
  std::__cxx11::string::~string((string *)&local_358);
  VW::config::typed_option<bool>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_338);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a0);
  std::__cxx11::string::~string((string *)&local_318);
  (**options->_vptr_options_i)(options,&new_options);
  if (svrg_option == false) {
    plVar2 = (learner<SVRG::svrg,_example> *)0x0;
  }
  else {
    (s._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->all = all;
    (s._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->prev_pass = -1;
    (s._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl)->stable_grad_count = 0;
    parameters::stride_shift(&all->weights,2);
    puVar3 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar3 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar2 = LEARNER::init_learner<SVRG::svrg,example,LEARNER::learner<char,example>>
                       (&s,SVRG::learn,SVRG::predict,1L << ((byte)*puVar3 & 0x3f));
    *(code **)(plVar2 + 0x80) = SVRG::save_load;
    *(undefined8 *)(plVar2 + 0x70) = *(undefined8 *)(plVar2 + 0x18);
    *(undefined8 *)(plVar2 + 0x78) = *(undefined8 *)(plVar2 + 0x20);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<SVRG::svrg,_void_(*)(void_*)>::~unique_ptr(&s);
  return (base_learner *)plVar2;
}

Assistant:

base_learner* svrg_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<svrg>();

  bool svrg_option = false;
  option_group_definition new_options("Stochastic Variance Reduced Gradient");
  new_options.add(make_option("svrg", svrg_option).keep().help("Streaming Stochastic Variance Reduced Gradient"))
      .add(make_option("stage_size", s->stage_size).default_value(1).help("Number of passes per SVRG stage"));
  options.add_and_parse(new_options);

  if (!svrg_option)
  {
    return nullptr;
  }

  s->all = &all;
  s->prev_pass = -1;
  s->stable_grad_count = 0;

  // Request more parameter storage (4 floats per feature)
  all.weights.stride_shift(2);
  learner<svrg, example>& l = init_learner(s, learn, predict, UINT64_ONE << all.weights.stride_shift());
  l.set_save_load(save_load);
  return make_base(l);
}